

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::CapturedStream::~CapturedStream(CapturedStream *this)

{
  char *__filename;
  CapturedStream *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  std::__cxx11::string::~string((string *)&this->filename_);
  return;
}

Assistant:

~CapturedStream() {
    remove(filename_.c_str());
  }